

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

rcode __thiscall olc::Sprite::LoadFromPGESprFile(Sprite *this,string *sImageFile,ResourcePack *pack)

{
  char cVar1;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar2;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar3;
  rcode rVar4;
  ulong uVar5;
  long lVar6;
  ResourceBuffer rb;
  istream is;
  undefined1 local_288 [64];
  pointer local_248;
  pointer local_238;
  long local_230 [2];
  ios_base local_220 [504];
  
  if (this->pColData != (Pixel *)0x0) {
    operator_delete__(this->pColData);
  }
  if (pack == (ResourcePack *)0x0) {
    std::ifstream::ifstream((string *)local_230);
    std::ifstream::open((string *)local_230,(_Ios_Openmode)sImageFile);
    cVar1 = std::__basic_file<char>::is_open();
    rVar4 = FAIL;
    if (cVar1 != '\0') {
      std::istream::read((char *)local_230,(long)this);
      std::istream::read((char *)local_230,(long)&this->height);
      lVar6 = (long)this->height * (long)this->width;
      uVar5 = 0xffffffffffffffff;
      if (-1 < (int)lVar6) {
        uVar5 = lVar6 * 4;
      }
      paVar2 = (anon_union_4_2_12391da5_for_Pixel_0 *)operator_new__(uVar5);
      if ((int)lVar6 != 0) {
        paVar3 = paVar2;
        do {
          *paVar3 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
          paVar3 = paVar3 + 1;
        } while (paVar3 != paVar2 + lVar6);
      }
      this->pColData = (Pixel *)paVar2;
      rVar4 = OK;
      std::istream::read((char *)local_230,(long)paVar2);
    }
    std::ifstream::~ifstream(local_230);
  }
  else {
    ResourcePack::GetFileBuffer((ResourceBuffer *)local_288,pack,sImageFile);
    std::istream::istream((istream *)local_230,(streambuf *)local_288);
    std::istream::read((char *)local_230,(long)this);
    std::istream::read((char *)local_230,(long)&this->height);
    lVar6 = (long)this->height * (long)this->width;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)lVar6) {
      uVar5 = lVar6 * 4;
    }
    paVar2 = (anon_union_4_2_12391da5_for_Pixel_0 *)operator_new__(uVar5);
    if ((int)lVar6 != 0) {
      paVar3 = paVar2;
      do {
        *paVar3 = (anon_union_4_2_12391da5_for_Pixel_0)0xff000000;
        paVar3 = paVar3 + 1;
      } while (paVar3 != paVar2 + lVar6);
    }
    this->pColData = (Pixel *)paVar2;
    std::istream::read((char *)local_230,(long)paVar2);
    local_230[0] = _VTT;
    *(undefined8 *)((long)local_230 + *(long *)(_VTT + -0x18)) = __ITM_deregisterTMCloneTable;
    local_230[1] = 0;
    std::ios_base::~ios_base(local_220);
    local_288._0_8_ = &PTR__ResourceBuffer_0019f688;
    if (local_248 != (pointer)0x0) {
      operator_delete(local_248,(long)local_238 - (long)local_248);
    }
    local_288._0_8_ = __assert_fail;
    std::locale::~locale((locale *)(local_288 + 0x38));
    rVar4 = OK;
  }
  return rVar4;
}

Assistant:

olc::rcode Sprite::LoadFromPGESprFile(const std::string& sImageFile, olc::ResourcePack* pack)
	{
		if (pColData) delete[] pColData;
		auto ReadData = [&](std::istream& is)
		{
			is.read((char*)&width, sizeof(int32_t));
			is.read((char*)&height, sizeof(int32_t));
			pColData = new Pixel[width * height];
			is.read((char*)pColData, (size_t)width * (size_t)height * sizeof(uint32_t));
		};

		// These are essentially Memory Surfaces represented by olc::Sprite
		// which load very fast, but are completely uncompressed
		if (pack == nullptr)
		{
			std::ifstream ifs;
			ifs.open(sImageFile, std::ifstream::binary);
			if (ifs.is_open())
			{
				ReadData(ifs);
				return olc::OK;
			}
			else
				return olc::FAIL;
		}
		else
		{
			ResourceBuffer rb = pack->GetFileBuffer(sImageFile);
			std::istream is(&rb);
			ReadData(is);
			return olc::OK;
		}
		return olc::FAIL;
	}